

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pdfa.c
# Opt level: O2

void HPDF_PDFA_ClearXmpExtensions(HPDF_Doc pdf)

{
  HPDF_List list;
  HPDF_MMgr mmgr;
  void *aptr;
  uint index;
  
  list = pdf->xmp_extensions;
  for (index = 0; index < list->count; index = index + 1) {
    mmgr = pdf->mmgr;
    aptr = HPDF_List_ItemAt(list,index);
    HPDF_FreeMem(mmgr,aptr);
  }
  HPDF_List_Clear(pdf->xmp_extensions);
  return;
}

Assistant:

void
HPDF_PDFA_ClearXmpExtensions(HPDF_Doc pdf)
{
    HPDF_UINT i;
    HPDF_List list;

    list = pdf->xmp_extensions;
    for (i = 0; i < list->count; i++) {
        HPDF_FreeMem(pdf->mmgr, HPDF_List_ItemAt(list, i));
    }
    HPDF_List_Clear(pdf->xmp_extensions);
}